

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.hh
# Opt level: O1

size_t __thiscall
OpenMesh::
PropertyT<OpenMesh::DefaultTraits::FaceT<OpenMesh::FinalMeshItemsT<MyTraits,_true>::ITraits,_OpenMesh::FinalMeshItemsT<MyTraits,_true>::Refs>_>
::store(PropertyT<OpenMesh::DefaultTraits::FaceT<OpenMesh::FinalMeshItemsT<MyTraits,_true>::ITraits,_OpenMesh::FinalMeshItemsT<MyTraits,_true>::Refs>_>
        *this,ostream *_ostr,bool _swap)

{
  int iVar1;
  undefined4 extraout_var;
  size_t sVar2;
  undefined4 extraout_var_00;
  ulong uVar3;
  size_t sVar4;
  
  iVar1 = (*(this->super_BaseProperty)._vptr_BaseProperty[0xb])();
  if (CONCAT44(extraout_var,iVar1) == 0) {
    sVar4 = 0;
  }
  else {
    uVar3 = 0;
    sVar4 = 0;
    do {
      sVar2 = IO::
              binary<OpenMesh::DefaultTraits::FaceT<OpenMesh::FinalMeshItemsT<MyTraits,_true>::ITraits,_OpenMesh::FinalMeshItemsT<MyTraits,_true>::Refs>_>
              ::store(_ostr,(this->data_).
                            super__Vector_base<OpenMesh::DefaultTraits::FaceT<OpenMesh::FinalMeshItemsT<MyTraits,_true>::ITraits,_OpenMesh::FinalMeshItemsT<MyTraits,_true>::Refs>,_std::allocator<OpenMesh::DefaultTraits::FaceT<OpenMesh::FinalMeshItemsT<MyTraits,_true>::ITraits,_OpenMesh::FinalMeshItemsT<MyTraits,_true>::Refs>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + uVar3,_swap);
      sVar4 = sVar4 + sVar2;
      uVar3 = uVar3 + 1;
      iVar1 = (*(this->super_BaseProperty)._vptr_BaseProperty[0xb])(this);
    } while (uVar3 < CONCAT44(extraout_var_00,iVar1));
  }
  return sVar4;
}

Assistant:

virtual size_t store( std::ostream& _ostr, bool _swap ) const
  {
    if ( IO::is_streamable<vector_type>() )
      return IO::store(_ostr, data_, _swap );
    size_t bytes = 0;
    for (size_t i=0; i<n_elements(); ++i)
      bytes += IO::store( _ostr, data_[i], _swap );
    return bytes;
  }